

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O3

void FreeUserData(UserData data)

{
  long lVar1;
  long lVar2;
  UserData paVar3;
  
  lVar2 = 0;
  paVar3 = data;
  do {
    lVar1 = 0;
    do {
      SUNDlsMat_destroyMat(paVar3->P[0][lVar1]);
      SUNDlsMat_destroyArray(paVar3->pivot[0][lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    lVar2 = lVar2 + 1;
    paVar3 = (UserData)(paVar3->P + 1);
  } while (lVar2 != 5);
  SUNDlsMat_destroyMat(data->acoef);
  free(data->bcoef);
  free(data->cox);
  free(data->coy);
  N_VDestroy(data->rates);
  free(data);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jy;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jy]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jy]);
    }
  }

  SUNDlsMat_destroyMat(acoef);
  free(bcoef);
  free(cox);
  free(coy);
  N_VDestroy(data->rates);
  free(data);
}